

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::DumpObjectDescription(Recycler *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  TrackerData *pTVar3;
  undefined8 *in_FS_OFFSET;
  TrackerData *trackerData;
  type_info *ptStack_20;
  bool isArray;
  type_info *typeinfo;
  void *objectAddress_local;
  Recycler *this_local;
  
  ptStack_20 = (type_info *)0x0;
  trackerData._7_1_ = false;
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    pTVar3 = GetTrackerData(this,objectAddress);
    if (pTVar3 == (TrackerData *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1f72,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    else {
      ptStack_20 = pTVar3->typeinfo;
      trackerData._7_1_ = (bool)(pTVar3->isArray & 1);
    }
  }
  RecyclerObjectDumper::DumpObject(ptStack_20,trackerData._7_1_,objectAddress);
  return;
}

Assistant:

void
Recycler::DumpObjectDescription(void *objectAddress)
{
#ifdef PROFILE_RECYCLER_ALLOC
    type_info const * typeinfo = nullptr;
    bool isArray = false;

    if (this->trackerDictionary)
    {
        TrackerData * trackerData = GetTrackerData(objectAddress);
        if (trackerData != nullptr)
        {
            typeinfo = trackerData->typeinfo;
            isArray = trackerData->isArray;
        }
        else
        {
            Assert(false);
        }
    }
    RecyclerObjectDumper::DumpObject(typeinfo, isArray, objectAddress);
#else
    Output::Print(_u("Address %p"), objectAddress);
#endif
}